

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

int __thiscall File::close(File *this,int __fd)

{
  int in_EAX;
  
  if (this->fp != (void *)0x0) {
    in_EAX = ::close((int)this->fp);
    this->fp = (void *)0x0;
  }
  return in_EAX;
}

Assistant:

void File::close()
{
#ifdef _WIN32
  if(fp != INVALID_HANDLE_VALUE)
  {
    CloseHandle((HANDLE)fp);
    fp = INVALID_HANDLE_VALUE;
  }
#else
  if(fp)
  {
    ::close((int)(intptr_t)fp);
    fp = 0;
  }
#endif
}